

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O0

void __thiscall
xray_re::xr_reader::
r_chunks<std::vector<xray_re::sector_item,std::allocator<xray_re::sector_item>>,read_item>
          (xr_reader *this,xr_reader *container)

{
  xr_reader *this_00;
  reference item;
  sector_item local_78;
  uint32_t local_2c;
  xr_reader *pxStack_28;
  uint32_t id;
  xr_reader *s;
  vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_> *container_local;
  xr_reader *this_local;
  
  local_2c = 0;
  s = container;
  container_local = (vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_> *)this;
  while( true ) {
    pxStack_28 = open_chunk(this,local_2c);
    this_00 = s;
    if (pxStack_28 == (xr_reader *)0x0) break;
    local_78.mesh.field_2._M_allocated_capacity = 0;
    local_78.mesh.field_2._8_8_ = 0;
    local_78.mesh._M_dataplus = (_Alloc_hider)0x0;
    local_78.mesh._1_7_ = 0;
    local_78.mesh._M_string_length = 0;
    local_78.object.field_2._M_allocated_capacity = 0;
    local_78.object.field_2._8_8_ = 0;
    local_78.object._M_dataplus = (_Alloc_hider)0x0;
    local_78.object._1_7_ = 0;
    local_78.object._M_string_length = 0;
    sector_item::sector_item(&local_78);
    std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::push_back
              ((vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_> *)this_00,
               &local_78);
    sector_item::~sector_item(&local_78);
    item = std::vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_>::back
                     ((vector<xray_re::sector_item,_std::allocator<xray_re::sector_item>_> *)s);
    read_item::operator()((read_item *)((long)&this_local + 7),item,pxStack_28);
    close_chunk(this,&stack0xffffffffffffffd8);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

inline void xr_reader::r_chunks(T& container, F read)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = open_chunk(id)); ++id) {
		container.push_back(typename T::value_type());
		read(container.back(), *s);
		close_chunk(s);
	}
}